

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  pointer pcVar1;
  tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar2;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar3;
  size_t sVar4;
  ReusableStringStream rss;
  string name;
  ReusableStringStream local_130;
  string local_118;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  TestCase local_d8;
  
  pcVar1 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar1,
             pcVar1 + (testCase->super_TestCaseInfo).name._M_string_length);
  if (local_f0 == 0) {
    local_130.super_NonCopyable._vptr_NonCopyable =
         (_func_int **)&PTR__ReusableStringStream_001c14d8;
    pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    sVar4 = StringStreams::add(&pSVar3->super_StringStreams);
    local_130.m_index = sVar4;
    pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    tVar2.
    super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&(pSVar3->super_StringStreams).m_streams.
              super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[sVar4]._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    local_130.m_oss =
         (ostream *)
         tVar2.
         super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               tVar2.
               super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,"Anonymous test case ",0x14);
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>
              ((ulong)tVar2.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_d8,testCase,&local_118);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_d8);
    if (local_d8.test.super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.test.super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8.super_TestCaseInfo.lcaseTags);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8.super_TestCaseInfo.tags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.super_TestCaseInfo.description._M_dataplus._M_p !=
        &local_d8.super_TestCaseInfo.description.field_2) {
      operator_delete(local_d8.super_TestCaseInfo.description._M_dataplus._M_p,
                      local_d8.super_TestCaseInfo.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.super_TestCaseInfo.className._M_dataplus._M_p !=
        &local_d8.super_TestCaseInfo.className.field_2) {
      operator_delete(local_d8.super_TestCaseInfo.className._M_dataplus._M_p,
                      local_d8.super_TestCaseInfo.className.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.super_TestCaseInfo.name._M_dataplus._M_p !=
        &local_d8.super_TestCaseInfo.name.field_2) {
      operator_delete(local_d8.super_TestCaseInfo.name._M_dataplus._M_p,
                      local_d8.super_TestCaseInfo.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    ReusableStringStream::~ReusableStringStream(&local_130);
  }
  else {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functions,testCase);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  return;
}

Assistant:

void TestRegistry::registerTest( TestCase const& testCase ) {
        std::string name = testCase.getTestCaseInfo().name;
        if( name.empty() ) {
            ReusableStringStream rss;
            rss << "Anonymous test case " << ++m_unnamedCount;
            return registerTest( testCase.withName( rss.str() ) );
        }
        m_functions.push_back( testCase );
    }